

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

Io_MvVar_t * Abc_NtkMvVarDup(Abc_Ntk_t *pNtk,Io_MvVar_t *pVar)

{
  Mem_Flex_t *p;
  char *pcVar1;
  size_t sVar2;
  int local_34;
  int i;
  Io_MvVar_t *pVarDup;
  Mem_Flex_t *pFlex;
  Io_MvVar_t *pVar_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pVar == (Io_MvVar_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    p = (Mem_Flex_t *)Abc_NtkMvVarMan(pNtk);
    if (p == (Mem_Flex_t *)0x0) {
      __assert_fail("pFlex != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                    ,0x88d,"Io_MvVar_t *Abc_NtkMvVarDup(Abc_Ntk_t *, Io_MvVar_t *)");
    }
    pNtk_local = (Abc_Ntk_t *)Mem_FlexEntryFetch(p,0x10);
    pNtk_local->ntkType = pVar->nValues;
    pNtk_local->pName = (char *)0x0;
    if (pVar->pNames != (char **)0x0) {
      pcVar1 = Mem_FlexEntryFetch(p,pVar->nValues << 3);
      pNtk_local->pName = pcVar1;
      for (local_34 = 0; local_34 < pVar->nValues; local_34 = local_34 + 1) {
        sVar2 = strlen(pVar->pNames[local_34]);
        pcVar1 = Mem_FlexEntryFetch(p,(int)sVar2 + 1);
        *(char **)(pNtk_local->pName + (long)local_34 * 8) = pcVar1;
        strcpy(*(char **)(pNtk_local->pName + (long)local_34 * 8),pVar->pNames[local_34]);
      }
    }
  }
  return (Io_MvVar_t *)pNtk_local;
}

Assistant:

Io_MvVar_t * Abc_NtkMvVarDup( Abc_Ntk_t * pNtk, Io_MvVar_t * pVar )
{
    Mem_Flex_t * pFlex;
    Io_MvVar_t * pVarDup;
    int i;
    if ( pVar == NULL )
        return NULL;
    pFlex = (Mem_Flex_t *)Abc_NtkMvVarMan( pNtk );
    assert( pFlex != NULL );
    pVarDup = (Io_MvVar_t *)Mem_FlexEntryFetch( pFlex, sizeof(Io_MvVar_t) );
    pVarDup->nValues = pVar->nValues;
    pVarDup->pNames = NULL;
    if ( pVar->pNames == NULL )
        return pVarDup;
    pVarDup->pNames = (char **)Mem_FlexEntryFetch( pFlex, sizeof(char *) * pVar->nValues );
    for ( i = 0; i < pVar->nValues; i++ )
    {
        pVarDup->pNames[i] = (char *)Mem_FlexEntryFetch( pFlex, strlen(pVar->pNames[i]) + 1 );
        strcpy( pVarDup->pNames[i], pVar->pNames[i] );
    }
    return pVarDup;
}